

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O2

ptr<req_msg> __thiscall
nuraft::raft_server::create_append_entries_req(raft_server *this,ptr<peer> *pp)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _func_int **pp_Var4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint uVar9;
  undefined1 *puVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  long lVar11;
  ulong uVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  ptr<req_msg> pVar15;
  ulong last_log_idx;
  unique_lock<std::recursive_mutex> guard;
  ulong term;
  ulong commit_idx;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  ptr<log_entry> custom_noti_le;
  ptr<std::vector<ptr<log_entry>_>_> log_entries;
  undefined1 local_74 [4];
  ptr<custom_notification_msg> custom_noti;
  ulong last_log_term;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58 [3];
  log_val_type local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  puVar1 = (undefined8 *)*in_RDX;
  commit_idx = 0;
  last_log_idx = 0;
  term = 0;
  local_58[2]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
  std::unique_lock<std::recursive_mutex>::unique_lock(&guard,(mutex_type *)(pp + 0x3e));
  uVar7 = (*(code *)((((pp[0x2e].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->config_).
                      super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    endpoint_).field_2._M_allocated_capacity)();
  puVar13 = (undefined1 *)
            ((long)&((pp[9].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1);
  commit_idx = (ulong)pp[10].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  term = (ulong)((pp[0x2d].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(puVar1 + 0x1b))->__data);
  if (puVar1[0xd] == 0) {
    LOCK();
    puVar1[0xd] = puVar13;
    UNLOCK();
  }
  last_log_idx = puVar1[0xd] - 1;
  pthread_mutex_unlock((pthread_mutex_t *)(puVar1 + 0x1b));
  p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (puVar13 <= last_log_idx) {
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (iVar6 = (*p_Var2->_vptr__Sp_counted_base[7])(), 1 < iVar6)) {
      p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      msg_if_given_abi_cxx11_
                ((string *)&guard,"Peer\'s lastLogIndex is too large %lu v.s. %lu, ",last_log_idx,
                 puVar13);
      (*p_Var2->_vptr__Sp_counted_base[8])
                (p_Var2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"create_append_entries_req",0x18b,(string *)&guard);
      std::__cxx11::string::~string((string *)&guard);
    }
    pp_Var4 = (pp[0x15].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_vptr__Sp_counted_base;
    (**(code **)(*pp_Var4 + 0x40))(pp_Var4,0xfffffffffffffff8);
    exit(-1);
  }
  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (iVar6 = (*p_Var2->_vptr__Sp_counted_base[7])(), 5 < iVar6)) {
    p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    msg_if_given_abi_cxx11_
              ((string *)&guard,"last_log_idx: %lu, starting_idx: %lu, cur_nxt_idx: %lu\n",
               last_log_idx,uVar7,puVar13);
    (*p_Var2->_vptr__Sp_counted_base[8])
              (p_Var2,6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
               ,"create_append_entries_req",0x199,(string *)&guard);
    std::__cxx11::string::~string((string *)&guard);
  }
  uVar8 = last_log_idx;
  nuraft::context::get_params((context *)&guard);
  puVar14 = (undefined1 *)
            (uVar8 + (long)*(int *)((long)&((guard._M_device)->super___recursive_mutex_base).
                                           _M_mutex + 0x24) + 1);
  if (puVar13 <= puVar14) {
    puVar14 = puVar13;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&guard._M_owns);
  local_58[1]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[0x3a];
  puVar10 = puVar14;
  if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(last_log_idx + 1) == local_58[1]._M_pi) &&
     ((undefined1 *)(last_log_idx + 2) < puVar14)) {
    LOCK();
    *(int *)(puVar1 + 0x3b) = *(int *)(puVar1 + 0x3b) + 1;
    UNLOCK();
    uVar9 = *(uint *)(puVar1 + 0x3b);
    p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (iVar6 = (*p_Var2->_vptr__Sp_counted_base[7])(), 4 < iVar6)) {
      p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      msg_if_given_abi_cxx11_
                ((string *)&guard,"last sent log (%lu) to peer %d is not applied, cnt %d",
                 local_58[1]._M_pi,(ulong)*(uint *)*puVar1,(ulong)uVar9);
      (*p_Var2->_vptr__Sp_counted_base[8])
                (p_Var2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"create_append_entries_req",0x1ad,&guard);
      std::__cxx11::string::~string((string *)&guard);
    }
    this_00._M_pi = local_a0._M_pi;
    if (4 < (int)uVar9) {
      puVar10 = (undefined1 *)(last_log_idx + 2);
      if (puVar13 <= (undefined1 *)(last_log_idx + 2)) {
        puVar10 = puVar13;
      }
      p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (iVar6 = (*p_Var2->_vptr__Sp_counted_base[7])(), this_00._M_pi = local_a0._M_pi, 4 < iVar6)
         ) {
        p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        msg_if_given_abi_cxx11_((string *)&guard,"reduce end_idx %lu -> %lu",puVar14,puVar10);
        (*p_Var2->_vptr__Sp_counted_base[8])
                  (p_Var2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x1b1,&guard);
        std::__cxx11::string::~string((string *)&guard);
        this_00._M_pi = local_a0._M_pi;
      }
    }
  }
  else {
    LOCK();
    *(undefined4 *)(puVar1 + 0x3b) = 0;
    UNLOCK();
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  }
  uVar12 = uVar8 + 1;
  log_entries.
  super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  log_entries.
  super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((undefined1 *)(last_log_idx + 1) < puVar13) {
    if (uVar7 <= uVar12) {
      peVar3 = pp[0x2e].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (**(code **)&((peVar3->config_).
                    super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   learner_)(&guard,peVar3,(undefined1 *)(last_log_idx + 1),puVar10,puVar1[0xf]);
      std::
      __shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ::operator=(&log_entries.
                   super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ,(__shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)&guard);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&guard._M_owns);
      if (log_entries.
          super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) goto LAB_00189cf7;
      p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (iVar6 = (*p_Var2->_vptr__Sp_counted_base[7])(), 2 < iVar6)) {
        p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)&guard,"failed to retrieve log entries: %lu - %lu",last_log_idx + 1,
                   puVar10);
        (*p_Var2->_vptr__Sp_counted_base[8])
                  (p_Var2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x1bf,&guard);
        std::__cxx11::string::~string((string *)&guard);
      }
    }
  }
  else {
    guard._M_device = (mutex_type *)0x0;
    guard._M_owns = false;
    guard._9_7_ = 0;
    std::
    __shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&log_entries.
                 super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ,(__shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)&guard);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&guard._M_owns);
    if (uVar7 <= uVar12) {
LAB_00189cf7:
      uVar8 = term_for_log((raft_server *)pp,last_log_idx);
      puVar13 = puVar10;
      last_log_term = uVar8;
      if ((log_entries.
           super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr == (element_type *)0x0) ||
         (puVar14 = (undefined1 *)
                    (last_log_idx +
                     ((long)((log_entries.
                              super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->
                            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)((log_entries.
                              super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->
                            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4) + 1),
         puVar14 == puVar10)) {
LAB_00189d38:
        p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        puVar14 = puVar13;
        if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (iVar6 = (*p_Var2->_vptr__Sp_counted_base[7])(), 4 < iVar6)) {
          if (log_entries.
              super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr == (element_type *)0x0) {
            lVar11 = 0;
          }
          else {
            lVar11 = (long)((log_entries.
                             super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->
                           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)((log_entries.
                             super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->
                           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 4;
          }
          p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)&guard,
                     "append_entries for %d with LastLogIndex=%lu, LastLogTerm=%lu, EntriesLength=%zu, CommitIndex=%lu, Term=%lu, peer_last_sent_idx %lu"
                     ,(ulong)*(uint *)*puVar1,last_log_idx,uVar8,lVar11,commit_idx,term,
                     local_58[1]._M_pi);
          (*p_Var2->_vptr__Sp_counted_base[8])
                    (p_Var2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"create_append_entries_req",0x208,&guard);
          std::__cxx11::string::~string((string *)&guard);
        }
      }
      else {
        p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar6 = (*p_Var2->_vptr__Sp_counted_base[7])();
          puVar13 = puVar14;
          if (5 < iVar6) {
            p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            msg_if_given_abi_cxx11_
                      ((string *)&guard,"adjusted end_idx due to batch size hint: %lu -> %lu",
                       puVar10,puVar14);
            (*p_Var2->_vptr__Sp_counted_base[8])
                      (p_Var2,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"create_append_entries_req",0x200,&guard);
            std::__cxx11::string::~string((string *)&guard);
          }
          goto LAB_00189d38;
        }
      }
      if ((undefined1 *)(last_log_idx + 1) == puVar14) {
        p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (iVar6 = (*p_Var2->_vptr__Sp_counted_base[7])(), 5 < iVar6)) {
          p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          msg_if_given_abi_cxx11_((string *)&guard,"EMPTY PAYLOAD");
          (*p_Var2->_vptr__Sp_counted_base[8])
                    (p_Var2,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"create_append_entries_req",0x20a,&guard);
          goto LAB_00189fb3;
        }
      }
      else {
        p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if ((undefined1 *)(last_log_idx + 2) == puVar14) {
          if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (iVar6 = (*p_Var2->_vptr__Sp_counted_base[7])(), 4 < iVar6)) {
            p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            msg_if_given_abi_cxx11_((string *)&guard,"idx: %lu",last_log_idx + 1);
            (*p_Var2->_vptr__Sp_counted_base[8])
                      (p_Var2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"create_append_entries_req",0x20c,&guard);
LAB_00189fb3:
            std::__cxx11::string::~string((string *)&guard);
          }
        }
        else if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                (iVar6 = (*p_Var2->_vptr__Sp_counted_base[7])(), 4 < iVar6)) {
          p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)&guard,"idx range: %lu-%lu",last_log_idx + 1,puVar14 + -1);
          (*p_Var2->_vptr__Sp_counted_base[8])
                    (p_Var2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"create_append_entries_req",0x20e,&guard);
          goto LAB_00189fb3;
        }
      }
      guard._M_device = (mutex_type *)CONCAT44(guard._M_device._4_4_,3);
      custom_noti.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr._0_4_ = *(undefined4 *)*puVar1;
      std::
      make_shared<nuraft::req_msg,unsigned_long&,nuraft::msg_type,int&,int,unsigned_long&,unsigned_long&,unsigned_long&>
                ((unsigned_long *)this_00._M_pi,(msg_type *)&term,(int *)&guard,
                 (int *)&pp[3].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(unsigned_long *)&custom_noti,&last_log_term,&last_log_idx);
      if (log_entries.
          super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        std::
        vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
        ::
        insert<__gnu_cxx::__normal_iterator<std::shared_ptr<nuraft::log_entry>*,std::vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>>,void>
                  ((vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
                    *)(((raft_server *)this_00._M_pi)->_vptr_raft_server + 7),
                   (shared_ptr<nuraft::log_entry> *)
                   ((raft_server *)this_00._M_pi)->_vptr_raft_server[8],
                   ((log_entries.
                     super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   ((log_entries.
                     super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish);
      }
      LOCK();
      puVar1[0x3a] = last_log_idx + 1;
      UNLOCK();
      goto LAB_0018a034;
    }
  }
  get_last_snapshot((raft_server *)&last_log_term);
  if (((last_log_term == 0) || (uVar7 <= last_log_idx)) || (*(ulong *)last_log_term <= last_log_idx)
     ) {
    if ((create_append_entries_req(std::shared_ptr<nuraft::peer>&)::msg_timer == '\0') &&
       (iVar6 = __cxa_guard_acquire(&create_append_entries_req(std::shared_ptr<nuraft::peer>&)::
                                     msg_timer), iVar6 != 0)) {
      timer_helper::timer_helper(&create_append_entries_req::msg_timer,5000000,false);
      __cxa_guard_release(&create_append_entries_req(std::shared_ptr<nuraft::peer>&)::msg_timer);
    }
    bVar5 = timer_helper::timeout_and_reset(&create_append_entries_req::msg_timer);
    p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar6 = (*p_Var2->_vptr__Sp_counted_base[7])();
      uVar9 = (uint)!bVar5 * 4 + 2;
      if ((int)uVar9 <= iVar6) {
        p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)&guard,
                   "neither snapshot nor log exists, peer %d, last log %lu, leader\'s start log %lu"
                   ,(ulong)*(uint *)*puVar1,last_log_idx,uVar7);
        (*p_Var2->_vptr__Sp_counted_base[8])
                  (p_Var2,(ulong)uVar9,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x1e2,&guard);
        std::__cxx11::string::~string((string *)&guard);
      }
    }
    guard._M_device = (mutex_type *)CONCAT44(guard._M_device._4_4_,0x1c);
    custom_noti.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._0_4_ = *(undefined4 *)*puVar1;
    custom_noti_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
         0;
    std::
    make_shared<nuraft::req_msg,unsigned_long&,nuraft::msg_type,int&,int,int,unsigned_long&,unsigned_long&>
              ((unsigned_long *)this_00._M_pi,(msg_type *)&term,(int *)&guard,
               (int *)&pp[3].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(int *)&custom_noti,(unsigned_long *)&custom_noti_le,
               &last_log_idx);
    std::make_shared<nuraft::out_of_log_msg>();
    *(ulong *)&((guard._M_device)->super___recursive_mutex_base)._M_mutex = uVar7;
    custom_noti_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
         1;
    std::make_shared<nuraft::custom_notification_msg,nuraft::custom_notification_msg::type>
              ((type *)&custom_noti);
    out_of_log_msg::serialize((out_of_log_msg *)&custom_noti_le);
    std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)
               (CONCAT44(custom_noti.
                         super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._4_4_,
                         custom_noti.
                         super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._0_4_) + 8),
               (__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&custom_noti_le);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&custom_noti_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_74 = (undefined1  [4])0x0;
    custom_notification_msg::serialize((custom_notification_msg *)local_40);
    std::make_shared<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
              ((int *)&custom_noti_le,(shared_ptr<nuraft::buffer> *)local_74,local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 *)(((raft_server *)this_00._M_pi)->_vptr_raft_server + 7),&custom_noti_le);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&custom_noti_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&custom_noti.
                super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&guard._M_owns);
  }
  else {
    p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (iVar6 = (*p_Var2->_vptr__Sp_counted_base[7])(), 4 < iVar6)) {
      p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      msg_if_given_abi_cxx11_
                ((string *)&guard,
                 "send snapshot peer %d, peer log idx: %lu, my starting idx: %lu, my log idx: %lu, last_snapshot_log_idx: %lu"
                 ,(ulong)*(uint *)*puVar1,last_log_idx,uVar7,puVar13,*(undefined8 *)last_log_term);
      (*p_Var2->_vptr__Sp_counted_base[8])
                (p_Var2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"create_append_entries_req",0x1d5,&guard);
      std::__cxx11::string::~string((string *)&guard);
    }
    guard._M_device = (mutex_type *)((ulong)guard._M_device & 0xffffffffffffff00);
    create_sync_snapshot_req
              ((raft_server *)this_00._M_pi,pp,(ulong)local_58[2]._M_pi,last_log_idx,term,
               (bool *)commit_idx);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
LAB_0018a034:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&log_entries.
              super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pVar15.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar15.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00._M_pi;
  return (ptr<req_msg>)pVar15.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<req_msg> raft_server::create_append_entries_req(ptr<peer>& pp) {
    peer& p = *pp;
    ulong cur_nxt_idx(0L);
    ulong commit_idx(0L);
    ulong last_log_idx(0L);
    ulong term(0L);
    ulong starting_idx(1L);

    {
        recur_lock(lock_);
        starting_idx = log_store_->start_index();
        cur_nxt_idx = precommit_index_ + 1;
        commit_idx = quick_commit_index_;
        term = state_->get_term();
    }

    {
        std::lock_guard<std::mutex> guard(p.get_lock());
        if (p.get_next_log_idx() == 0L) {
            p.set_next_log_idx(cur_nxt_idx);
        }

        last_log_idx = p.get_next_log_idx() - 1;
    }

    if (last_log_idx >= cur_nxt_idx) {
        // LCOV_EXCL_START
        p_er( "Peer's lastLogIndex is too large %" PRIu64 " v.s. %" PRIu64 ", ",
              last_log_idx, cur_nxt_idx );
        ctx_->state_mgr_->system_exit(raft_err::N8_peer_last_log_idx_too_large);
        ::exit(-1);
        return ptr<req_msg>();
        // LCOV_EXCL_STOP
    }

    // cur_nxt_idx: last log index of myself (leader).
    // starting_idx: start log index of myself (leader).
    // last_log_idx: last log index of replica (follower).
    // end_idx: if (cur_nxt_idx - last_log_idx) > max_append_size, limit it.

    p_tr("last_log_idx: %" PRIu64 ", starting_idx: %" PRIu64
         ", cur_nxt_idx: %" PRIu64 "\n",
         last_log_idx, starting_idx, cur_nxt_idx);

    // Verify log index range.
    bool entries_valid = (last_log_idx + 1 >= starting_idx);

    // Read log entries. The underlying log store may have removed some log entries
    // causing some of the requested entries to be unavailable. The log store should
    // return nullptr to indicate such errors.
    ulong end_idx = std::min( cur_nxt_idx,
                              last_log_idx + 1 + ctx_->get_params()->max_append_size_ );

    // NOTE: If this is a retry, probably the follower is down.
    //       Send just one log until it comes back
    //       (i.e., max_append_size_ = 1).
    //       Only when end_idx - start_idx > 1, and 5th try.
    ulong peer_last_sent_idx = p.get_last_sent_idx();
    if ( last_log_idx + 1 == peer_last_sent_idx &&
         last_log_idx + 2 < end_idx ) {
        int32 cur_cnt = p.inc_cnt_not_applied();
        p_db("last sent log (%" PRIu64 ") to peer %d is not applied, cnt %d",
             peer_last_sent_idx, p.get_id(), cur_cnt);
        if (cur_cnt >= 5) {
            ulong prev_end_idx = end_idx;
            end_idx = std::min( cur_nxt_idx, last_log_idx + 1 + 1 );
            p_db("reduce end_idx %" PRIu64 " -> %" PRIu64, prev_end_idx, end_idx);
        }
    } else {
        p.reset_cnt_not_applied();
    }

    ptr<std::vector<ptr<log_entry>>> log_entries;
    if ((last_log_idx + 1) >= cur_nxt_idx) {
        log_entries = ptr<std::vector<ptr<log_entry>>>();
    } else if (entries_valid) {
        log_entries = log_store_->log_entries_ext(last_log_idx + 1, end_idx,
                                                  p.get_next_batch_size_hint_in_bytes());
        if (log_entries == nullptr) {
            p_wn("failed to retrieve log entries: %" PRIu64 " - %" PRIu64,
                 last_log_idx + 1, end_idx);
            entries_valid = false;
        }
    }

    if (!entries_valid) {
        // Required log entries are missing. First, we try to use snapshot to recover.
        // To avoid inconsistency due to smart pointer, should have local varaible
        // to increase its ref count.
        ptr<snapshot> snp_local = get_last_snapshot();

        // Modified by Jung-Sang Ahn (Oct 11 2017):
        // As `reserved_log` has been newly added, need to check snapshot
        // in addition to `starting_idx`.
        if ( snp_local &&
             last_log_idx < starting_idx &&
             last_log_idx < snp_local->get_last_log_idx() ) {
            p_db( "send snapshot peer %d, peer log idx: %" PRIu64
                  ", my starting idx: %" PRIu64 ", "
                  "my log idx: %" PRIu64 ", last_snapshot_log_idx: %" PRIu64,
                  p.get_id(),
                  last_log_idx, starting_idx, cur_nxt_idx,
                  snp_local->get_last_log_idx() );

            bool succeeded_out = false;
            return create_sync_snapshot_req( pp, last_log_idx, term,
                                             commit_idx, succeeded_out );
        }

        // Cannot recover using snapshot. Return here to protect the leader.
        static timer_helper msg_timer(5000000);
        int log_lv = msg_timer.timeout_and_reset() ? L_ERROR : L_TRACE;
        p_lv(log_lv,
             "neither snapshot nor log exists, peer %d, last log %" PRIu64 ", "
             "leader's start log %" PRIu64,
             p.get_id(), last_log_idx, starting_idx);

        // Send out-of-log-range notification to this follower.
        ptr<req_msg> req = cs_new<req_msg>
                           ( term, msg_type::custom_notification_request,
                             id_, p.get_id(), 0, last_log_idx, commit_idx );

        // Out-of-log message.
        ptr<out_of_log_msg> ool_msg = cs_new<out_of_log_msg>();
        ool_msg->start_idx_of_leader_ = starting_idx;

        // Create a notification containing OOL message.
        ptr<custom_notification_msg> custom_noti =
            cs_new<custom_notification_msg>
            ( custom_notification_msg::out_of_log_range_warning );
        custom_noti->ctx_ = ool_msg->serialize();

        // Wrap it using log_entry.
        ptr<log_entry> custom_noti_le =
            cs_new<log_entry>(0, custom_noti->serialize(), log_val_type::custom);

        req->log_entries().push_back(custom_noti_le);
        return req;
    }

    ulong last_log_term = term_for_log(last_log_idx);
    ulong adjusted_end_idx = end_idx;
    if (log_entries) adjusted_end_idx = last_log_idx + 1 + log_entries->size();
    if (adjusted_end_idx != end_idx) {
        p_tr("adjusted end_idx due to batch size hint: %" PRIu64 " -> %" PRIu64,
             end_idx, adjusted_end_idx);
    }

    p_db( "append_entries for %d with LastLogIndex=%" PRIu64 ", "
          "LastLogTerm=%" PRIu64 ", EntriesLength=%zu, CommitIndex=%" PRIu64 ", "
          "Term=%" PRIu64 ", peer_last_sent_idx %" PRIu64,
          p.get_id(), last_log_idx, last_log_term,
          ( log_entries ? log_entries->size() : 0 ), commit_idx, term,
          peer_last_sent_idx );
    if (last_log_idx+1 == adjusted_end_idx) {
        p_tr( "EMPTY PAYLOAD" );
    } else if (last_log_idx+1 + 1 == adjusted_end_idx) {
        p_db( "idx: %" PRIu64, last_log_idx+1 );
    } else {
        p_db( "idx range: %" PRIu64 "-%" PRIu64, last_log_idx+1, adjusted_end_idx-1 );
    }

    ptr<req_msg> req
        ( cs_new<req_msg>
          ( term, msg_type::append_entries_request, id_, p.get_id(),
            last_log_term, last_log_idx, commit_idx ) );
    std::vector<ptr<log_entry>>& v = req->log_entries();
    if (log_entries) {
        v.insert(v.end(), log_entries->begin(), log_entries->end());
    }
    p.set_last_sent_idx(last_log_idx + 1);

    return req;
}